

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall Function::print(Function *this)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  Statements *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  int local_40;
  int i;
  string local_30 [32];
  Function *local_10;
  Function *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"def ");
  (*(this->super_Statement)._vptr_Statement[3])();
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"(");
  std::__cxx11::string::~string(local_30);
  local_40 = 0;
  while( true ) {
    uVar2 = (ulong)local_40;
    paramenters_abi_cxx11_(&local_58,this);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    if (sVar3 <= uVar2) break;
    if (local_40 != 0) {
      std::operator<<((ostream *)&std::cout,",");
    }
    paramenters_abi_cxx11_(&local_70,this);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_70,(long)local_40);
    std::operator<<((ostream *)&std::cout,(string *)pvVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
    local_40 = local_40 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = statements(this);
  Statements::print(this_00);
  return;
}

Assistant:

void Function::print() {
    std::cout <<"def "<< id() << "(";
    for(int i = 0; i < paramenters().size();i++){
        if(i != 0)std::cout << ",";
        std::cout << paramenters()[i];
    }
    std::cout << "):" << std::endl;
    statements()->print();
}